

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_tools.cxx
# Opt level: O2

void __thiscall db_packer::process_folder(db_packer *this,string *path)

{
  bool bVar1;
  directory_entry *this_00;
  recursive_directory_iterator __end1;
  recursive_directory_iterator local_b8;
  __shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  path fullpath;
  __shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  local_48;
  __shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  local_30;
  
  std::operator+(&local_90,&this->m_root,path);
  std::filesystem::__cxx11::path::path(&fullpath,&local_90,auto_format);
  std::__cxx11::string::~string((string *)&local_90);
  bVar1 = std::filesystem::exists(&fullpath);
  if (bVar1) {
    bVar1 = std::filesystem::is_directory(&fullpath);
    if (bVar1) {
      std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
                ((recursive_directory_iterator *)&local_a0,&fullpath);
      std::
      __shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
      ::__shared_ptr(&local_48,&local_a0);
      local_b8._M_dirs._M_ptr = local_48._M_ptr;
      local_b8._M_dirs._M_refcount._M_pi = local_48._M_refcount._M_pi;
      local_48._M_ptr = (element_type *)0x0;
      local_48._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
                ((recursive_directory_iterator *)&local_48);
      std::
      __shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
      ::__shared_ptr(&local_30,&local_a0);
      __end1._M_dirs._M_ptr = (element_type *)0x0;
      __end1._M_dirs._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
                ((recursive_directory_iterator *)&local_30);
      while (local_b8._M_dirs._M_refcount._M_pi != __end1._M_dirs._M_refcount._M_pi) {
        this_00 = (directory_entry *)
                  std::filesystem::__cxx11::recursive_directory_iterator::operator*(&local_b8);
        bVar1 = std::filesystem::__cxx11::directory_entry::is_regular_file(this_00);
        if (bVar1) {
          std::__cxx11::string::string((string *)&local_90,(string *)this_00);
          process_file(this,&local_90);
          std::__cxx11::string::~string((string *)&local_90);
        }
        std::filesystem::__cxx11::recursive_directory_iterator::operator++(&local_b8);
      }
      std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator(&__end1)
      ;
      std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
                (&local_b8);
      std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
                ((recursive_directory_iterator *)&local_a0);
    }
  }
  std::filesystem::__cxx11::path::~path(&fullpath);
  return;
}

Assistant:

void db_packer::process_folder(const std::string& path)
{
#ifdef WIN32
	if (!path.empty()) {
		for (std::vector<std::string>::iterator it = m_folders.begin(),
				end = m_folders.end(); it != end; ++it) {
			if (path.compare(0, it->size(), *it) == 0) {
				*it = path;
				goto found;
			}
		}
		m_folders.push_back(path);
	}
found:
	WIN32_FIND_DATAA info;
	HANDLE h = FindFirstFileA((m_root + path + '*').c_str(), &info);
	if (h == INVALID_HANDLE_VALUE)
		return;
	do {
		xr_strlwr(info.cFileName, sizeof(info.cFileName));
		if (info.dwFileAttributes & FILE_ATTRIBUTE_DIRECTORY) {
			if (std::strcmp(info.cFileName, ".") != 0 && std::strcmp(info.cFileName, "..") != 0)
				process_folder((path + info.cFileName) + '\\');
		} else {
			process_file(path + info.cFileName);
		}
	} while (FindNextFileA(h, &info));
	FindClose(h);
#else
	fs::path fullpath(m_root + path);

	if(!fs::exists(fullpath) || !fs::is_directory(fullpath))
		return;

	for(auto const& de: fs::recursive_directory_iterator(fullpath))
	{
		if(de.is_regular_file())
			process_file(de.path());
	}
#endif
}